

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O0

void __thiscall
Dual_Resampler::dual_play(Dual_Resampler *this,long count,dsample_t *out,Blip_Buffer *blip_buf)

{
  short *psVar1;
  void *in_RDX;
  dsample_t *in_RSI;
  Blip_Buffer *in_RDI;
  Dual_Resampler *unaff_retaddr;
  long remain;
  dsample_t *local_28;
  void *local_18;
  Blip_Buffer *blip_buf_00;
  
  local_28 = (dsample_t *)(long)(in_RDI->bass_shift_ - (int)in_RDI->sample_rate_);
  local_18 = in_RDX;
  blip_buf_00 = in_RDI;
  if (local_28 != (dsample_t *)0x0) {
    if ((long)in_RSI < (long)local_28) {
      local_28 = in_RSI;
    }
    in_RSI = (dsample_t *)((long)in_RSI - (long)local_28);
    psVar1 = blargg_vector<short>::operator[]
                       ((blargg_vector<short> *)&in_RDI->buffer_,(long)(int)in_RDI->sample_rate_);
    memcpy(in_RDX,psVar1,(long)local_28 << 1);
    local_18 = (void *)((long)local_28 * 2 + (long)in_RDX);
    *(int *)&in_RDI->sample_rate_ = (int)in_RDI->sample_rate_ + (int)local_28;
  }
  for (; (long)in_RDI->bass_shift_ <= (long)in_RSI;
      in_RSI = (dsample_t *)((long)in_RSI - (long)in_RDI->bass_shift_)) {
    play_frame_(unaff_retaddr,blip_buf_00,in_RSI);
    local_18 = (void *)((long)local_18 + (long)in_RDI->bass_shift_ * 2);
  }
  if (in_RSI != (dsample_t *)0x0) {
    blargg_vector<short>::begin((blargg_vector<short> *)&in_RDI->buffer_);
    play_frame_(unaff_retaddr,blip_buf_00,in_RSI);
    *(int *)&in_RDI->sample_rate_ = (int)in_RSI;
    psVar1 = blargg_vector<short>::begin((blargg_vector<short> *)&in_RDI->buffer_);
    memcpy(local_18,psVar1,(long)in_RSI << 1);
  }
  return;
}

Assistant:

void Dual_Resampler::dual_play( long count, dsample_t* out, Blip_Buffer& blip_buf )
{
	// empty extra buffer
	long remain = sample_buf_size - buf_pos;
	if ( remain )
	{
		if ( remain > count )
			remain = count;
		count -= remain;
		memcpy( out, &sample_buf [buf_pos], remain * sizeof *out );
		out += remain;
		buf_pos += remain;
	}
	
	// entire frames
	while ( count >= (long) sample_buf_size )
	{
		play_frame_( blip_buf, out );
		out += sample_buf_size;
		count -= sample_buf_size;
	}
	
	// extra
	if ( count )
	{
		play_frame_( blip_buf, sample_buf.begin() );
		buf_pos = count;
		memcpy( out, sample_buf.begin(), count * sizeof *out );
		out += count;
	}
}